

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::StructSchema::findFieldByName
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,StructSchema *this,
          StringPtr name)

{
  RawSchema *pRVar1;
  NullableValue<capnp::StructSchema::Field> *pNVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Field candidate;
  ArrayPtr<const_char> local_f8;
  StringPtr local_e8;
  Field local_d8;
  Reader local_98;
  FieldList local_68;
  
  pRVar1 = ((this->super_Schema).raw)->generic;
  getFields(&local_68,this);
  uVar3 = pRVar1->memberCount;
  uVar7 = 0;
  local_e8.content.ptr = name.content.ptr;
  local_e8.content.size_ = name.content.size_;
  while( true ) {
    uVar5 = uVar3;
    if (uVar5 <= uVar7) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    FieldList::operator[]
              (&local_d8,&local_68,
               (uint)*(ushort *)((long)pRVar1->membersByName + (ulong)(uVar7 + uVar5 & 0xfffffffe)))
    ;
    local_98._reader.dataSize = local_d8.proto._reader.dataSize;
    local_98._reader.pointerCount = local_d8.proto._reader.pointerCount;
    local_98._reader._38_2_ = local_d8.proto._reader._38_2_;
    local_98._reader.nestingLimit = local_d8.proto._reader.nestingLimit;
    local_98._reader._44_4_ = local_d8.proto._reader._44_4_;
    local_98._reader.data = local_d8.proto._reader.data;
    local_98._reader.pointers = local_d8.proto._reader.pointers;
    local_98._reader.segment = local_d8.proto._reader.segment;
    local_98._reader.capTable = local_d8.proto._reader.capTable;
    local_f8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_98);
    bVar4 = kj::StringPtr::operator==((StringPtr *)&local_f8,&local_e8);
    if (bVar4) break;
    uVar6 = uVar7 + uVar5 >> 1;
    bVar4 = kj::StringPtr::operator<((StringPtr *)&local_f8,&local_e8);
    uVar3 = uVar6;
    if (bVar4) {
      uVar3 = uVar5;
      uVar7 = uVar6 + 1;
    }
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
       (RawBrandedSchema *)local_d8.parent.super_Schema.raw;
  *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_d8._8_8_;
  (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment = local_d8.proto._reader.segment
  ;
  (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
       local_d8.proto._reader.capTable;
  (__return_storage_ptr__->ptr).field_1.value.proto._reader.data = local_d8.proto._reader.data;
  (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
       local_d8.proto._reader.pointers;
  pNVar2 = &__return_storage_ptr__->ptr;
  *(StructDataBitCount *)((long)&pNVar2->field_1 + 0x30) = local_d8.proto._reader.dataSize;
  *(StructPointerCount *)((long)&pNVar2->field_1 + 0x34) = local_d8.proto._reader.pointerCount;
  *(undefined2 *)((long)&pNVar2->field_1 + 0x36) = local_d8.proto._reader._38_2_;
  *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
       local_d8.proto._reader.nestingLimit;
  *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x3c) =
       local_d8.proto._reader._44_4_;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> StructSchema::findFieldByName(kj::StringPtr name) const {
  return findSchemaMemberByName(raw->generic, name, getFields());
}